

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::ColladaLoader::BuildHierarchy(ColladaLoader *this,ColladaParser *pParser,Node *pNode)

{
  pointer ppNVar1;
  aiNode *this_00;
  aiNode **ppaVar2;
  pointer ppNVar3;
  aiNode *paVar4;
  uint uVar5;
  ulong uVar6;
  vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_> instances;
  undefined1 local_68 [8];
  pointer ppNStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [3];
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  FindNameForNode_abi_cxx11_((string *)local_68,this,pNode);
  ppNVar1 = ppNStack_60;
  if (ppNStack_60 < &DAT_00000400) {
    (this_00->mName).length = (ai_uint32)ppNStack_60;
    memcpy((this_00->mName).data,(void *)local_68,(size_t)ppNStack_60);
    (this_00->mName).data[(long)ppNVar1] = '\0';
  }
  if (local_68 != (undefined1  [8])local_58) {
    operator_delete((void *)local_68,local_58[0]._M_allocated_capacity + 1);
  }
  ColladaParser::CalculateResultTransform((aiMatrix4x4 *)local_68,pParser,&pNode->mTransforms);
  (this_00->mTransformation).d1 = (float)local_58[2]._0_4_;
  (this_00->mTransformation).d2 = (float)local_58[2]._4_4_;
  (this_00->mTransformation).d3 = (float)local_58[2]._8_4_;
  (this_00->mTransformation).d4 = (float)local_58[2]._12_4_;
  (this_00->mTransformation).c1 = (float)local_58[1]._0_4_;
  (this_00->mTransformation).c2 = (float)local_58[1]._4_4_;
  (this_00->mTransformation).c3 = (float)local_58[1]._8_4_;
  (this_00->mTransformation).c4 = (float)local_58[1]._12_4_;
  (this_00->mTransformation).b1 = (float)local_58[0]._0_4_;
  (this_00->mTransformation).b2 = (float)local_58[0]._4_4_;
  (this_00->mTransformation).b3 = (float)local_58[0]._8_4_;
  (this_00->mTransformation).b4 = (float)local_58[0]._12_4_;
  (this_00->mTransformation).a1 = (float)local_68._0_4_;
  (this_00->mTransformation).a2 = (float)local_68._4_4_;
  *(pointer *)&(this_00->mTransformation).a3 = ppNStack_60;
  local_68 = (undefined1  [8])0x0;
  ppNStack_60 = (pointer)0x0;
  local_58[0]._M_allocated_capacity = 0;
  ResolveNodeInstances
            (this,pParser,pNode,
             (vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
              *)local_68);
  uVar5 = (int)((long)ppNStack_60 - (long)local_68 >> 3) +
          (int)((long)(pNode->mChildren).
                      super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pNode->mChildren).
                      super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
  this_00->mNumChildren = uVar5;
  ppaVar2 = (aiNode **)operator_new__((ulong)uVar5 << 3);
  this_00->mChildren = ppaVar2;
  ppNVar3 = (pNode->mChildren).
            super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((pNode->mChildren).
      super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    uVar6 = 0;
    do {
      paVar4 = BuildHierarchy(this,pParser,ppNVar3[uVar6]);
      this_00->mChildren[uVar6] = paVar4;
      this_00->mChildren[uVar6]->mParent = this_00;
      uVar6 = uVar6 + 1;
      ppNVar3 = (pNode->mChildren).
                super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(pNode->mChildren).
                                   super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3))
    ;
  }
  if ((undefined1  [8])ppNStack_60 != local_68) {
    uVar6 = 0;
    do {
      paVar4 = BuildHierarchy(this,pParser,*(Node **)((long)local_68 + uVar6 * 8));
      *(aiNode **)
       ((long)this_00->mChildren +
       (long)(pNode->mChildren).
             super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish +
       (uVar6 * 8 -
       (long)(pNode->mChildren).
             super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start)) = paVar4;
      *(aiNode **)
       (*(long *)((long)this_00->mChildren +
                 (long)(pNode->mChildren).
                       super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (uVar6 * 8 -
                 (long)(pNode->mChildren).
                       super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)) + 0x448) = this_00;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)ppNStack_60 - (long)local_68 >> 3));
  }
  BuildMeshesForNode(this,pParser,pNode,this_00);
  BuildCamerasForNode(this,pParser,pNode,this_00);
  BuildLightsForNode(this,pParser,pNode,this_00);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,local_58[0]._M_allocated_capacity - (long)local_68);
  }
  return this_00;
}

Assistant:

aiNode* ColladaLoader::BuildHierarchy(const ColladaParser& pParser, const Collada::Node* pNode) {
    // create a node for it
    aiNode* node = new aiNode();

    // find a name for the new node. It's more complicated than you might think
    node->mName.Set(FindNameForNode(pNode));

    // calculate the transformation matrix for it
    node->mTransformation = pParser.CalculateResultTransform(pNode->mTransforms);

    // now resolve node instances
    std::vector<const Collada::Node*> instances;
    ResolveNodeInstances(pParser, pNode, instances);

    // add children. first the *real* ones
    node->mNumChildren = static_cast<unsigned int>(pNode->mChildren.size() + instances.size());
    node->mChildren = new aiNode*[node->mNumChildren];

    for (size_t a = 0; a < pNode->mChildren.size(); ++a) {
        node->mChildren[a] = BuildHierarchy(pParser, pNode->mChildren[a]);
        node->mChildren[a]->mParent = node;
    }

    // ... and finally the resolved node instances
    for (size_t a = 0; a < instances.size(); ++a) {
        node->mChildren[pNode->mChildren.size() + a] = BuildHierarchy(pParser, instances[a]);
        node->mChildren[pNode->mChildren.size() + a]->mParent = node;
    }

    // construct meshes
    BuildMeshesForNode(pParser, pNode, node);

    // construct cameras
    BuildCamerasForNode(pParser, pNode, node);

    // construct lights
    BuildLightsForNode(pParser, pNode, node);

    return node;
}